

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O3

istream * amrex::operator>>(istream *is,CoordSys *c)

{
  istream *this;
  double *pdVar1;
  long lVar2;
  int tmp;
  int coord;
  Real cellsize [3];
  int local_40;
  CoordType local_3c;
  Real local_38 [3];
  
  this = (istream *)std::istream::ignore((long)is,100000);
  std::istream::operator>>(this,&local_3c);
  c->c_sys = local_3c;
  pdVar1 = (double *)std::istream::ignore((long)is,100000);
  std::istream::_M_extract<double>(pdVar1);
  pdVar1 = (double *)std::istream::ignore((long)is,100000);
  std::istream::_M_extract<double>(pdVar1);
  pdVar1 = (double *)std::istream::ignore((long)is,100000);
  std::istream::_M_extract<double>(pdVar1);
  std::istream::ignore((long)is,100000);
  pdVar1 = (double *)std::istream::ignore((long)is,100000);
  std::istream::_M_extract<double>(pdVar1);
  pdVar1 = (double *)std::istream::ignore((long)is,100000);
  std::istream::_M_extract<double>(pdVar1);
  pdVar1 = (double *)std::istream::ignore((long)is,100000);
  std::istream::_M_extract<double>(pdVar1);
  std::istream::ignore((long)is,100000);
  std::istream::operator>>((istream *)is,&local_40);
  c->ok = local_40 != 0;
  std::istream::ignore((long)is,100000);
  c->dx[0] = local_38[0];
  c->dx[1] = local_38[1];
  c->dx[2] = local_38[2];
  lVar2 = 0;
  do {
    c->inv_dx[lVar2] = 1.0 / local_38[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return is;
}

Assistant:

std::istream&
operator>> (std::istream& is,
            CoordSys&     c)
{
    int coord;
    is.ignore(BL_IGNORE_MAX, '(') >> coord;
    c.c_sys = (CoordSys::CoordType) coord;
    AMREX_D_EXPR(is.ignore(BL_IGNORE_MAX, '(') >> c.offset[0],
                 is.ignore(BL_IGNORE_MAX, ',') >> c.offset[1],
                 is.ignore(BL_IGNORE_MAX, ',') >> c.offset[2]);
    is.ignore(BL_IGNORE_MAX, ')');
    Real cellsize[3];
    AMREX_D_EXPR(is.ignore(BL_IGNORE_MAX, '(') >> cellsize[0],
                 is.ignore(BL_IGNORE_MAX, ',') >> cellsize[1],
                 is.ignore(BL_IGNORE_MAX, ',') >> cellsize[2]);
    is.ignore(BL_IGNORE_MAX, ')');
    int tmp;
    is >> tmp;
    c.ok = tmp?true:false;
    is.ignore(BL_IGNORE_MAX, '\n');
    for (int k = 0; k < AMREX_SPACEDIM; k++)
    {
        c.dx[k] = cellsize[k];
        c.inv_dx[k] = 1.0_rt/cellsize[k];
    }
    return is;
}